

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdTest44(void)

{
  word wStack_7e8;
  int nNonDec;
  word t;
  char *pStr;
  char pRes [2000];
  
  t = (word)anon_var_dwarf_2a4a96;
  wStack_7e8 = Dau_Dsd6ToTruth("[dc<a(cbd)(!c!b!d)>{abef}]");
  Dau_DsdDecompose(&stack0xfffffffffffff818,6,1,1,(char *)&pStr);
  return;
}

Assistant:

void Dau_DsdTest44()
{
    char pRes[DAU_MAX_STR];
//    char * pStr = "(!(!a<bcd>)!(!fe))";
//    char * pStr = "([acb]<!edf>)";
//    char * pStr = "!(f!(b!c!(d[ea])))";
//    char * pStr = "[!(a[be])!(c!df)]";
//    char * pStr = "<(e<bca>)fd>";
//    char * pStr = "[d8001{abef}c]";
    char * pStr = "[dc<a(cbd)(!c!b!d)>{abef}]";
//    char * pStr3;
    word t = Dau_Dsd6ToTruth( pStr );
//    return;
    int nNonDec = Dau_DsdDecompose( &t, 6, 1, 1, pRes );
//    Dau_DsdNormalize( pStr2 );
//    Dau_DsdExtract( pStr, 2, 0 );
    t = 0; 
    nNonDec = 0;
}